

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O2

void __thiscall libtorrent::dht::traversal_algorithm::add_router_entries(traversal_algorithm *this)

{
  uint uVar1;
  dht_observer *pdVar2;
  int iVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  node *pnVar6;
  digest32<160L> local_44;
  
  pnVar6 = this->m_node;
  pdVar2 = pnVar6->m_observer;
  if (pdVar2 != (dht_observer *)0x0) {
    iVar3 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,4);
    pnVar6 = this->m_node;
    if ((char)iVar3 != '\0') {
      uVar1 = this->m_id;
      uVar4 = ::std::
              __distance<std::_Rb_tree_const_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
                        ((pnVar6->m_table).m_router_nodes._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_left,
                         &(pnVar6->m_table).m_router_nodes._M_t._M_impl.super__Rb_tree_header);
      (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
                (pdVar2,4,"[%u] using router nodes to initiate traversal algorithm %d routers",
                 (ulong)uVar1,uVar4 & 0xffffffff);
      pnVar6 = this->m_node;
    }
  }
  for (p_Var5 = (pnVar6->m_table).m_router_nodes._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var5 !=
      &(pnVar6->m_table).m_router_nodes._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5)) {
    digest32<160L>::clear(&local_44);
    add_entry(this,&local_44,(endpoint *)(p_Var5 + 1),(observer_flags_t)0x2);
  }
  return;
}

Assistant:

void traversal_algorithm::add_router_entries()
{
	INVARIANT_CHECK;
#ifndef TORRENT_DISABLE_LOGGING
	dht_observer* logger = get_node().observer();
	if (logger != nullptr && logger->should_log(dht_logger::traversal))
	{
		logger->log(dht_logger::traversal
			, "[%u] using router nodes to initiate traversal algorithm %d routers"
			, m_id, int(std::distance(m_node.m_table.begin(), m_node.m_table.end())));
	}
#endif
	for (auto const& n : m_node.m_table)
		add_entry(node_id(), n, observer::flag_initial);
}